

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpArgument
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_int arg_index,size_t size,
          void *pBuffer)

{
  string fileName;
  char enqueueCount [256];
  allocator local_169;
  string local_168;
  pthread_mutex_t *local_148;
  size_t local_140;
  string local_138 [8];
  
  if (kernel != (cl_kernel)0x0) {
    local_148 = (pthread_mutex_t *)&this->m_Mutex;
    local_140 = size;
    std::mutex::lock((mutex *)&local_148->__data);
    std::__cxx11::string::string((string *)&local_168,"",(allocator *)local_138);
    std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,&local_169);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,local_138,&local_168);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::append((char *)&local_168);
    OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&local_168);
    snprintf((char *)local_138,0x100,"%04u",enqueueCounter & 0xffffffff);
    std::__cxx11::string::append((char *)&local_168);
    std::__cxx11::string::append((char *)&local_168);
    std::__cxx11::string::append((char *)&local_168);
    getShortKernelName_abi_cxx11_(local_138,this,kernel);
    std::__cxx11::string::append((string *)&local_168);
    std::__cxx11::string::~string((string *)local_138);
    snprintf((char *)local_138,0x100,"%d",(ulong)(uint)arg_index);
    std::__cxx11::string::append((char *)&local_168);
    std::__cxx11::string::append((char *)&local_168);
    std::__cxx11::string::append((char *)&local_168);
    if (pBuffer != (void *)0x0) {
      dumpMemoryToFile(this,&local_168,false,pBuffer,local_140);
    }
    std::__cxx11::string::~string((string *)&local_168);
    pthread_mutex_unlock(local_148);
  }
  return;
}

Assistant:

void CLIntercept::dumpArgument(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_int arg_index,
    size_t size,
    const void *pBuffer )
{
    if( kernel )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/SetKernelArg/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );
            fileName += "SetKernelArg_";
            fileName += enqueueCount;
        }

        // Add the kernel name to the file name
        {
            fileName += "_Kernel_";
            fileName += getShortKernelName(kernel);
        }

        // Add the arg number to the file name
        {
            char    argName[ MAX_PATH ];

            CLI_SPRINTF( argName, MAX_PATH, "%d", arg_index );

            fileName += "_Arg_";
            fileName += argName;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        if( pBuffer != NULL)
        {
            dumpMemoryToFile(
                fileName,
                false,
                pBuffer,
                size );
        }
    }
}